

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O0

void __thiscall CDataFileReader::ReplaceData(CDataFileReader *this,int Index,char *pData,int Size)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  int in_ESI;
  long *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((-1 < in_ESI) && (in_ESI < *(int *)(*in_RDI + 0x78))) {
    GetDataImpl((CDataFileReader *)CONCAT44(Size,in_stack_00000008),unaff_retaddr_00,unaff_retaddr);
    UnloadData((CDataFileReader *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20));
    *(undefined8 *)(*(long *)(*in_RDI + 0x88) + (long)in_ESI * 8) = in_RDX;
    *(undefined4 *)(*(long *)(*in_RDI + 0x90) + (long)in_ESI * 4) = in_ECX;
  }
  return;
}

Assistant:

void CDataFileReader::ReplaceData(int Index, char *pData, int Size)
{
	if(Index < 0 || Index >= m_pDataFile->m_Header.m_NumRawData)
		return;

	// make sure the data has been loaded
	GetDataImpl(Index, 0);

	UnloadData(Index);
	m_pDataFile->m_ppDataPtrs[Index] = pData;
	m_pDataFile->m_pDataSizes[Index] = Size;
}